

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAndRgEa<(moira::Instr)59,(moira::Mode)0,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  char *pcVar5;
  char cVar6;
  
  bVar4 = str->upper;
  pcVar5 = "eor";
  if ((bool)bVar4 != false) {
    pcVar5 = "EOR";
  }
  cVar6 = *pcVar5;
  if (cVar6 != '\0') {
    do {
      pcVar5 = pcVar5 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar6;
      cVar6 = *pcVar5;
    } while (cVar6 != '\0');
    bVar4 = str->upper;
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar4 & 1) << 5 | 0x42;
  iVar1 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar1) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  str->ptr = pcVar5 + 1;
  *pcVar5 = 'D';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)(op >> 9) & 7 | 0x30;
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ' ';
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = 'D';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmAndRgEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}